

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

IndexType GetIndexTypeFromPrimitive
                    (Var indexVar,ScriptContext *scriptContext,uint32 *index,
                    PropertyRecord **propertyRecord,JavascriptString **propertyNameString,
                    bool createIfNotFound,bool preferJavascriptStringOverPropertyRecord)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  charcount_t propertyLength;
  IndexType IVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JavascriptSymbol *pJVar7;
  JavascriptString *this;
  char16 *str;
  uint32 value;
  uint32 local_88 [2];
  char16 stringBuffer [22];
  bool local_31 [8];
  bool isInt32;
  
  unique0x10000262 = propertyNameString;
  if (((ulong)indexVar & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)indexVar & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab15d4;
    *puVar6 = 0;
  }
  if (((ulong)indexVar & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)indexVar & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00ab15d4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    value = (uint32)indexVar;
    if (-1 < (int)value) {
      *index = value;
      return IndexType_Number;
    }
    iVar3 = Js::TaggedInt::ToBuffer(value,(char16 *)local_88,0x16);
    if (createIfNotFound || preferJavascriptStringOverPropertyRecord) {
      Js::ScriptContext::GetOrAddPropertyRecord
                (scriptContext,stringBuffer + (long)iVar3 + -4,0x15 - iVar3,propertyRecord);
    }
    else {
      Js::ScriptContext::FindPropertyRecord
                (scriptContext,stringBuffer + (long)iVar3 + -4,0x15 - iVar3,propertyRecord);
    }
  }
  else {
    if ((ulong)indexVar >> 0x32 != 0) {
      local_88[0] = 0;
      local_31[0] = false;
      bVar2 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                        ((double)((ulong)indexVar ^ 0xfffc000000000000),(int32 *)local_88,local_31);
      if ((bVar2) && (local_88[0] != 0xffffffff && local_31[0] == false)) {
        *index = local_88[0];
        return IndexType_Number;
      }
    }
    bVar2 = Js::VarIs<Js::JavascriptSymbol>(indexVar);
    if (bVar2) {
      pJVar7 = Js::UnsafeVarTo<Js::JavascriptSymbol>(indexVar);
    }
    else {
      pJVar7 = (JavascriptSymbol *)0x0;
    }
    if (pJVar7 == (JavascriptSymbol *)0x0) {
      this = Js::JavascriptConversion::ToString(indexVar,scriptContext);
      str = Js::JavascriptString::GetString(this);
      propertyLength = Js::JavascriptString::GetLength(this);
      if (!preferJavascriptStringOverPropertyRecord || createIfNotFound) {
        IVar4 = GetIndexTypeFromString
                          (str,propertyLength,scriptContext,index,propertyRecord,createIfNotFound);
        return IVar4;
      }
      BVar5 = Js::NumberUtilities::TryConvertToUInt32(str,propertyLength,index);
      if ((BVar5 != 0) && (*index != 0xffffffff)) {
        return IndexType_Number;
      }
      *stack0xffffffffffffffa8 = this;
      return IndexType_JavascriptString;
    }
    *propertyRecord = (pJVar7->propertyRecordUsageCache).propertyRecord.ptr;
  }
  return IndexType_PropertyId;
}

Assistant:

IndexType GetIndexTypeFromPrimitive(Var indexVar, ScriptContext* scriptContext, uint32* index, PropertyRecord const ** propertyRecord, JavascriptString ** propertyNameString, bool createIfNotFound, bool preferJavascriptStringOverPropertyRecord)
    {
        // CONSIDER: Only OP_SetElementI and OP_GetElementI use and take advantage of the
        // IndexType_JavascriptString result. Consider modifying other callers of GetIndexType to take
        // advantage of non-interned property strings where appropriate.
        if (TaggedInt::Is(indexVar))
        {
            int indexInt = TaggedInt::ToInt32(indexVar);
            if (indexInt >= 0)
            {
                *index = (uint)indexInt;
                return IndexType_Number;
            }
            else
            {
                char16 stringBuffer[22];

                int pos = TaggedInt::ToBuffer(indexInt, stringBuffer, _countof(stringBuffer));
                charcount_t length = (_countof(stringBuffer) - 1) - pos;
                if (createIfNotFound || preferJavascriptStringOverPropertyRecord)
                {
                    // When preferring JavascriptString objects, just return a PropertyRecord instead
                    // of creating temporary JavascriptString objects for every negative integer that
                    // comes through here.
                    scriptContext->GetOrAddPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                else
                {
                    scriptContext->FindPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                return IndexType_PropertyId;
            }
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(indexVar))
        {
            // If this double can be a positive integer index, convert it.
            int32 value = 0;
            bool isInt32 = false;
            if (JavascriptNumber::TryGetInt32OrUInt32Value(JavascriptNumber::GetValue(indexVar), &value, &isInt32)
                && !isInt32
                && static_cast<uint32>(value) < JavascriptArray::InvalidIndex)
            {
                *index = static_cast<uint32>(value);
                return IndexType_Number;
            }

            // Fall through to slow string conversion.
        }

        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(indexVar);
        if (symbol)
        {
            // JavascriptSymbols cannot add a new PropertyRecord - they correspond to one and only one existing PropertyRecord.
            // We already know what the PropertyRecord is since it is stored in the JavascriptSymbol itself so just return it.

            *propertyRecord = symbol->GetValue();
            return IndexType_PropertyId;
        }
        else
        {
            JavascriptString* indexStr = JavascriptConversion::ToString(indexVar, scriptContext);

            char16 const * propertyName = indexStr->GetString();
            charcount_t const propertyLength = indexStr->GetLength();

            if (!createIfNotFound && preferJavascriptStringOverPropertyRecord)
            {
                if (JavascriptOperators::TryConvertToUInt32(propertyName, propertyLength, index) &&
                    (*index != JavascriptArray::InvalidIndex))
                {
                    return IndexType_Number;
                }

                *propertyNameString = indexStr;
                return IndexType_JavascriptString;
            }
            return GetIndexTypeFromString(propertyName, propertyLength, scriptContext, index, propertyRecord, createIfNotFound);
        }
    }